

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instancenorm.cpp
# Opt level: O1

int __thiscall
ncnn::InstanceNorm::forward_inplace(InstanceNorm *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  int iVar3;
  size_t sVar4;
  void *pvVar5;
  void *pvVar6;
  size_t sVar7;
  uint uVar8;
  void *pvVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  iVar3 = this->channels;
  if (0 < (long)iVar3) {
    uVar8 = bottom_top_blob->h * bottom_top_blob->w;
    pvVar9 = bottom_top_blob->data;
    sVar4 = bottom_top_blob->cstep;
    pvVar5 = (this->gamma_data).data;
    pvVar6 = (this->beta_data).data;
    uVar12 = (ulong)uVar8;
    sVar7 = bottom_top_blob->elemsize;
    lVar11 = 0;
    do {
      fVar14 = 0.0;
      fVar13 = 0.0;
      if (0 < (int)uVar8) {
        uVar10 = 0;
        do {
          fVar13 = fVar13 + *(float *)((long)pvVar9 + uVar10 * 4);
          uVar10 = uVar10 + 1;
        } while (uVar12 != uVar10);
      }
      fVar13 = fVar13 * (1.0 / (float)(int)uVar8);
      if (0 < (int)uVar8) {
        fVar14 = 0.0;
        uVar10 = 0;
        do {
          fVar15 = *(float *)((long)pvVar9 + uVar10 * 4) - fVar13;
          fVar14 = fVar14 + fVar15 * fVar15;
          uVar10 = uVar10 + 1;
        } while (uVar12 != uVar10);
      }
      if (0 < (int)uVar8) {
        fVar15 = *(float *)((long)pvVar5 + lVar11 * 4);
        fVar1 = *(float *)((long)pvVar6 + lVar11 * 4);
        fVar2 = this->eps;
        uVar10 = 0;
        do {
          *(float *)((long)pvVar9 + uVar10 * 4) =
               (*(float *)((long)pvVar9 + uVar10 * 4) - fVar13) * fVar15 *
               (1.0 / SQRT(fVar14 * (1.0 / (float)(int)uVar8) + fVar2)) + fVar1;
          uVar10 = uVar10 + 1;
        } while (uVar12 != uVar10);
      }
      lVar11 = lVar11 + 1;
      pvVar9 = (void *)((long)pvVar9 + sVar4 * sVar7);
    } while (lVar11 != iVar3);
  }
  return 0;
}

Assistant:

int InstanceNorm::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    // x = (x - mean) / (sqrt(var) + eps) * gamma + beta

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int size = w * h;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        // mean and var
        float sum = 0.f;
        float sqsum = 0.f;
        for (int i=0; i<size; i++)
        {
            sum += ptr[i];
            //sqsum += ptr[i] * ptr[i];
        }
        float mean = sum / size;
        float tmp = 0.f;
        for (int i=0; i<size; i++)
        {
            tmp = ptr[i] - mean;
            sqsum += tmp * tmp;
        }
        float var = sqsum / size;
        // the var maybe minus due to accuracy
        //float var = sqsum / size - mean * mean;

        float gamma = gamma_data[q];
        float beta = beta_data[q];

        float a = static_cast<float>(gamma / (sqrt(var + eps)));
        float b = - mean * a + beta;

        for (int i=0; i<size; i++)
        {
            ptr[i] = ptr[i] * a + b;
        }
    }

    return 0;
}